

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O3

void GradientFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  uint8_t uVar52;
  uint8_t uVar53;
  uint8_t uVar54;
  uint8_t uVar55;
  uint8_t uVar56;
  uint8_t uVar57;
  uint8_t uVar58;
  uint8_t uVar59;
  uint8_t uVar60;
  uint8_t uVar61;
  uint8_t uVar62;
  uint8_t uVar63;
  uint8_t uVar64;
  uint8_t uVar65;
  uint8_t uVar66;
  uint8_t uVar67;
  uint8_t uVar68;
  uint8_t uVar69;
  uint8_t uVar70;
  uint8_t uVar71;
  uint8_t uVar72;
  uint8_t uVar73;
  uint8_t uVar74;
  uint8_t uVar75;
  uint8_t uVar76;
  uint8_t uVar77;
  uint8_t uVar78;
  uint8_t uVar79;
  uint8_t uVar80;
  uint8_t uVar81;
  uint8_t uVar82;
  uint8_t uVar83;
  uint8_t uVar84;
  uint8_t uVar85;
  uint8_t uVar86;
  uint8_t uVar87;
  undefined1 auVar88 [15];
  unkuint9 Var89;
  undefined1 auVar90 [11];
  undefined1 auVar91 [15];
  unkuint9 Var92;
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  unkuint9 Var95;
  undefined1 auVar96 [11];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  ulong uVar103;
  long lVar104;
  uint8_t *puVar105;
  int iVar106;
  char cVar107;
  uint uVar108;
  int iVar109;
  uint8_t *puVar110;
  uint8_t *puVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  
  *filtered_data = *data;
  uVar108 = width - 1;
  if ((int)(uVar108 & 0xffffffe0) < 1) {
    uVar103 = 0;
  }
  else {
    uVar103 = 0;
    do {
      puVar111 = data + uVar103;
      uVar26 = puVar111[1];
      uVar27 = puVar111[2];
      uVar28 = puVar111[3];
      uVar29 = puVar111[4];
      uVar30 = puVar111[5];
      uVar31 = puVar111[6];
      uVar32 = puVar111[7];
      uVar33 = puVar111[8];
      uVar34 = puVar111[9];
      uVar35 = puVar111[10];
      uVar36 = puVar111[0xb];
      uVar37 = puVar111[0xc];
      uVar38 = puVar111[0xd];
      uVar39 = puVar111[0xe];
      uVar40 = puVar111[0xf];
      puVar105 = data + uVar103 + 1;
      uVar41 = puVar105[1];
      uVar42 = puVar105[2];
      uVar43 = puVar105[3];
      uVar44 = puVar105[4];
      uVar45 = puVar105[5];
      uVar46 = puVar105[6];
      uVar47 = puVar105[7];
      uVar48 = puVar105[8];
      uVar49 = puVar105[9];
      uVar50 = puVar105[10];
      uVar51 = puVar105[0xb];
      uVar52 = puVar105[0xc];
      uVar53 = puVar105[0xd];
      uVar54 = puVar105[0xe];
      uVar55 = puVar105[0xf];
      puVar110 = data + uVar103 + 0x10;
      uVar56 = *puVar110;
      uVar57 = puVar110[1];
      uVar58 = puVar110[2];
      uVar59 = puVar110[3];
      uVar60 = puVar110[4];
      uVar61 = puVar110[5];
      uVar62 = puVar110[6];
      uVar63 = puVar110[7];
      uVar64 = puVar110[8];
      uVar65 = puVar110[9];
      uVar66 = puVar110[10];
      uVar67 = puVar110[0xb];
      uVar68 = puVar110[0xc];
      uVar69 = puVar110[0xd];
      uVar70 = puVar110[0xe];
      uVar71 = puVar110[0xf];
      puVar110 = data + uVar103 + 0x11;
      uVar72 = *puVar110;
      uVar73 = puVar110[1];
      uVar74 = puVar110[2];
      uVar75 = puVar110[3];
      uVar76 = puVar110[4];
      uVar77 = puVar110[5];
      uVar78 = puVar110[6];
      uVar79 = puVar110[7];
      uVar80 = puVar110[8];
      uVar81 = puVar110[9];
      uVar82 = puVar110[10];
      uVar83 = puVar110[0xb];
      uVar84 = puVar110[0xc];
      uVar85 = puVar110[0xd];
      uVar86 = puVar110[0xe];
      uVar87 = puVar110[0xf];
      puVar110 = filtered_data + uVar103 + 1;
      *puVar110 = *puVar105 - *puVar111;
      puVar110[1] = uVar41 - uVar26;
      puVar110[2] = uVar42 - uVar27;
      puVar110[3] = uVar43 - uVar28;
      puVar110[4] = uVar44 - uVar29;
      puVar110[5] = uVar45 - uVar30;
      puVar110[6] = uVar46 - uVar31;
      puVar110[7] = uVar47 - uVar32;
      puVar110[8] = uVar48 - uVar33;
      puVar110[9] = uVar49 - uVar34;
      puVar110[10] = uVar50 - uVar35;
      puVar110[0xb] = uVar51 - uVar36;
      puVar110[0xc] = uVar52 - uVar37;
      puVar110[0xd] = uVar53 - uVar38;
      puVar110[0xe] = uVar54 - uVar39;
      puVar110[0xf] = uVar55 - uVar40;
      puVar111 = filtered_data + uVar103 + 0x11;
      *puVar111 = uVar72 - uVar56;
      puVar111[1] = uVar73 - uVar57;
      puVar111[2] = uVar74 - uVar58;
      puVar111[3] = uVar75 - uVar59;
      puVar111[4] = uVar76 - uVar60;
      puVar111[5] = uVar77 - uVar61;
      puVar111[6] = uVar78 - uVar62;
      puVar111[7] = uVar79 - uVar63;
      puVar111[8] = uVar80 - uVar64;
      puVar111[9] = uVar81 - uVar65;
      puVar111[10] = uVar82 - uVar66;
      puVar111[0xb] = uVar83 - uVar67;
      puVar111[0xc] = uVar84 - uVar68;
      puVar111[0xd] = uVar85 - uVar69;
      puVar111[0xe] = uVar86 - uVar70;
      puVar111[0xf] = uVar87 - uVar71;
      uVar103 = uVar103 + 0x20;
    } while (uVar103 < (uVar108 & 0xffffffe0));
  }
  if ((int)uVar103 < (int)uVar108) {
    uVar103 = uVar103 & 0xffffffff;
    do {
      filtered_data[uVar103 + 1] = data[uVar103 + 1] - data[uVar103];
      uVar103 = uVar103 + 1;
    } while (uVar108 != uVar103);
  }
  if (1 < height) {
    lVar104 = (long)stride;
    puVar110 = filtered_data + lVar104 + 1;
    puVar105 = data + lVar104 + 1;
    puVar111 = data + lVar104;
    iVar106 = 1;
    do {
      filtered_data[lVar104] = data[lVar104] - (data + lVar104)[-lVar104];
      uVar103 = 0;
      if (0 < (int)(uVar108 & 0xfffffff8)) {
        uVar103 = 0;
        do {
          uVar1 = *(ulong *)(puVar105 + (uVar103 - 1));
          uVar2 = *(ulong *)(data + uVar103 + 1);
          uVar3 = *(ulong *)(data + uVar103);
          uVar4 = *(undefined8 *)(puVar105 + uVar103);
          auVar5._8_6_ = 0;
          auVar5._0_8_ = uVar1;
          auVar5[0xe] = (char)(uVar1 >> 0x38);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar1;
          auVar8[0xc] = (char)(uVar1 >> 0x30);
          auVar8._13_2_ = auVar5._13_2_;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar1;
          auVar11._12_3_ = auVar8._12_3_;
          auVar14._8_2_ = 0;
          auVar14._0_8_ = uVar1;
          auVar14[10] = (char)(uVar1 >> 0x28);
          auVar14._11_4_ = auVar11._11_4_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = uVar1;
          auVar17._10_5_ = auVar14._10_5_;
          auVar20[8] = (char)(uVar1 >> 0x20);
          auVar20._0_8_ = uVar1;
          auVar20._9_6_ = auVar17._9_6_;
          auVar88._7_8_ = 0;
          auVar88._0_7_ = auVar20._8_7_;
          Var89 = CONCAT81(SUB158(auVar88 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar97._9_6_ = 0;
          auVar97._0_9_ = Var89;
          auVar90._1_10_ = SUB1510(auVar97 << 0x30,5);
          auVar90[0] = (char)(uVar1 >> 0x10);
          auVar98._11_4_ = 0;
          auVar98._0_11_ = auVar90;
          auVar23[2] = (char)(uVar1 >> 8);
          auVar23._0_2_ = (ushort)uVar1;
          auVar23._3_12_ = SUB1512(auVar98 << 0x20,3);
          auVar6._8_6_ = 0;
          auVar6._0_8_ = uVar2;
          auVar6[0xe] = (char)(uVar2 >> 0x38);
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar2;
          auVar9[0xc] = (char)(uVar2 >> 0x30);
          auVar9._13_2_ = auVar6._13_2_;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = uVar2;
          auVar12._12_3_ = auVar9._12_3_;
          auVar15._8_2_ = 0;
          auVar15._0_8_ = uVar2;
          auVar15[10] = (char)(uVar2 >> 0x28);
          auVar15._11_4_ = auVar12._11_4_;
          auVar18._8_2_ = 0;
          auVar18._0_8_ = uVar2;
          auVar18._10_5_ = auVar15._10_5_;
          auVar21[8] = (char)(uVar2 >> 0x20);
          auVar21._0_8_ = uVar2;
          auVar21._9_6_ = auVar18._9_6_;
          auVar91._7_8_ = 0;
          auVar91._0_7_ = auVar21._8_7_;
          Var92 = CONCAT81(SUB158(auVar91 << 0x40,7),(char)(uVar2 >> 0x18));
          auVar99._9_6_ = 0;
          auVar99._0_9_ = Var92;
          auVar93._1_10_ = SUB1510(auVar99 << 0x30,5);
          auVar93[0] = (char)(uVar2 >> 0x10);
          auVar100._11_4_ = 0;
          auVar100._0_11_ = auVar93;
          auVar24[2] = (char)(uVar2 >> 8);
          auVar24._0_2_ = (ushort)uVar2;
          auVar24._3_12_ = SUB1512(auVar100 << 0x20,3);
          auVar7._8_6_ = 0;
          auVar7._0_8_ = uVar3;
          auVar7[0xe] = (char)(uVar3 >> 0x38);
          auVar10._8_4_ = 0;
          auVar10._0_8_ = uVar3;
          auVar10[0xc] = (char)(uVar3 >> 0x30);
          auVar10._13_2_ = auVar7._13_2_;
          auVar13._8_4_ = 0;
          auVar13._0_8_ = uVar3;
          auVar13._12_3_ = auVar10._12_3_;
          auVar16._8_2_ = 0;
          auVar16._0_8_ = uVar3;
          auVar16[10] = (char)(uVar3 >> 0x28);
          auVar16._11_4_ = auVar13._11_4_;
          auVar19._8_2_ = 0;
          auVar19._0_8_ = uVar3;
          auVar19._10_5_ = auVar16._10_5_;
          auVar22[8] = (char)(uVar3 >> 0x20);
          auVar22._0_8_ = uVar3;
          auVar22._9_6_ = auVar19._9_6_;
          auVar94._7_8_ = 0;
          auVar94._0_7_ = auVar22._8_7_;
          Var95 = CONCAT81(SUB158(auVar94 << 0x40,7),(char)(uVar3 >> 0x18));
          auVar101._9_6_ = 0;
          auVar101._0_9_ = Var95;
          auVar96._1_10_ = SUB1510(auVar101 << 0x30,5);
          auVar96[0] = (char)(uVar3 >> 0x10);
          auVar102._11_4_ = 0;
          auVar102._0_11_ = auVar96;
          auVar25[2] = (char)(uVar3 >> 8);
          auVar25._0_2_ = (ushort)uVar3;
          auVar25._3_12_ = SUB1512(auVar102 << 0x20,3);
          sVar112 = (((ushort)uVar2 & 0xff) + ((ushort)uVar1 & 0xff)) - ((ushort)uVar3 & 0xff);
          sVar113 = (auVar24._2_2_ + auVar23._2_2_) - auVar25._2_2_;
          sVar114 = (auVar93._0_2_ + auVar90._0_2_) - auVar96._0_2_;
          sVar115 = ((short)Var92 + (short)Var89) - (short)Var95;
          sVar116 = (auVar21._8_2_ + auVar20._8_2_) - auVar22._8_2_;
          sVar117 = (auVar15._10_2_ + auVar14._10_2_) - auVar16._10_2_;
          sVar118 = (auVar9._12_2_ + auVar8._12_2_) - auVar10._12_2_;
          sVar119 = ((auVar6._13_2_ >> 8) + (auVar5._13_2_ >> 8)) - (auVar7._13_2_ >> 8);
          *(ulong *)(puVar110 + uVar103) =
               CONCAT17((char)((ulong)uVar4 >> 0x38) -
                        ((0 < sVar119) * (sVar119 < 0x100) * (char)sVar119 - (0xff < sVar119)),
                        CONCAT16((char)((ulong)uVar4 >> 0x30) -
                                 ((0 < sVar118) * (sVar118 < 0x100) * (char)sVar118 -
                                 (0xff < sVar118)),
                                 CONCAT15((char)((ulong)uVar4 >> 0x28) -
                                          ((0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 -
                                          (0xff < sVar117)),
                                          CONCAT14((char)((ulong)uVar4 >> 0x20) -
                                                   ((0 < sVar116) * (sVar116 < 0x100) *
                                                    (char)sVar116 - (0xff < sVar116)),
                                                   CONCAT13((char)((ulong)uVar4 >> 0x18) -
                                                            ((0 < sVar115) * (sVar115 < 0x100) *
                                                             (char)sVar115 - (0xff < sVar115)),
                                                            CONCAT12((char)((ulong)uVar4 >> 0x10) -
                                                                     ((0 < sVar114) *
                                                                      (sVar114 < 0x100) *
                                                                      (char)sVar114 -
                                                                     (0xff < sVar114)),
                                                                     CONCAT11((char)((ulong)uVar4 >>
                                                                                    8) -
                                                                              ((0 < sVar113) *
                                                                               (sVar113 < 0x100) *
                                                                               (char)sVar113 -
                                                                              (0xff < sVar113)),
                                                                              (char)uVar4 -
                                                                              ((0 < sVar112) *
                                                                               (sVar112 < 0x100) *
                                                                               (char)sVar112 -
                                                                              (0xff < sVar112)))))))
                                ));
          uVar103 = uVar103 + 8;
        } while (uVar103 < (uVar108 & 0xfffffff8));
      }
      if ((int)uVar103 < (int)uVar108) {
        uVar103 = uVar103 & 0xffffffff;
        do {
          iVar109 = ((uint)data[uVar103 + 1] + (uint)puVar111[uVar103]) - (uint)data[uVar103];
          if (iVar109 < 1) {
            iVar109 = 0;
          }
          cVar107 = (char)iVar109;
          if (0xfe < iVar109) {
            cVar107 = -1;
          }
          puVar110[uVar103] = puVar111[uVar103 + 1] - cVar107;
          uVar103 = uVar103 + 1;
        } while (uVar108 != uVar103);
      }
      filtered_data = filtered_data + lVar104;
      iVar106 = iVar106 + 1;
      puVar110 = puVar110 + lVar104;
      puVar105 = puVar105 + lVar104;
      puVar111 = puVar111 + lVar104;
      data = data + lVar104;
    } while (iVar106 != height);
  }
  return;
}

Assistant:

static void GradientFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                int width, int height, int stride,
                                uint8_t* WEBP_RESTRICT filtered_data) {
  DoGradientFilter_SSE2(data, width, height, stride, filtered_data);
}